

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O1

vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> * __thiscall
AssemblyCode::SubRegRegCommand::GetOut
          (vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *__return_storage_ptr__,
          SubRegRegCommand *this)

{
  pointer pcVar1;
  initializer_list<IRT::CTemp> __l;
  allocator_type local_39;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  pcVar1 = (this->leftOperand).name._M_dataplus._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + (this->leftOperand).name._M_string_length);
  __l._M_len = 1;
  __l._M_array = (iterator)local_38;
  std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::vector(__return_storage_ptr__,__l,&local_39)
  ;
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<IRT::CTemp> AssemblyCode::SubRegRegCommand::GetOut( ) const {
    return { leftOperand };
}